

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseSVG(NSVGparser *p,char **attr)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  int local_1c;
  int i;
  char **attr_local;
  NSVGparser *p_local;
  
  for (local_1c = 0; attr[local_1c] != (char *)0x0; local_1c = local_1c + 2) {
    iVar1 = nsvg__parseAttr(p,attr[local_1c],attr[local_1c + 1]);
    if (iVar1 == 0) {
      iVar1 = strcmp(attr[local_1c],"width");
      if (iVar1 == 0) {
        fVar3 = nsvg__parseCoordinate(p,attr[local_1c + 1],0.0,1.0);
        p->image->width = fVar3;
      }
      else {
        iVar1 = strcmp(attr[local_1c],"height");
        if (iVar1 == 0) {
          fVar3 = nsvg__parseCoordinate(p,attr[local_1c + 1],0.0,1.0);
          p->image->height = fVar3;
        }
        else {
          iVar1 = strcmp(attr[local_1c],"viewBox");
          if (iVar1 == 0) {
            __isoc99_sscanf(attr[local_1c + 1],"%f%*[%%, \t]%f%*[%%, \t]%f%*[%%, \t]%f",&p->viewMinx
                            ,&p->viewMiny,&p->viewWidth,&p->viewHeight);
          }
          else {
            iVar1 = strcmp(attr[local_1c],"preserveAspectRatio");
            if (iVar1 == 0) {
              pcVar2 = strstr(attr[local_1c + 1],"none");
              if (pcVar2 == (char *)0x0) {
                pcVar2 = strstr(attr[local_1c + 1],"xMin");
                if (pcVar2 == (char *)0x0) {
                  pcVar2 = strstr(attr[local_1c + 1],"xMid");
                  if (pcVar2 == (char *)0x0) {
                    pcVar2 = strstr(attr[local_1c + 1],"xMax");
                    if (pcVar2 != (char *)0x0) {
                      p->alignX = 2;
                    }
                  }
                  else {
                    p->alignX = 1;
                  }
                }
                else {
                  p->alignX = 0;
                }
                pcVar2 = strstr(attr[local_1c + 1],"yMin");
                if (pcVar2 == (char *)0x0) {
                  pcVar2 = strstr(attr[local_1c + 1],"yMid");
                  if (pcVar2 == (char *)0x0) {
                    pcVar2 = strstr(attr[local_1c + 1],"yMax");
                    if (pcVar2 != (char *)0x0) {
                      p->alignY = 2;
                    }
                  }
                  else {
                    p->alignY = 1;
                  }
                }
                else {
                  p->alignY = 0;
                }
                p->alignType = 1;
                pcVar2 = strstr(attr[local_1c + 1],"slice");
                if (pcVar2 != (char *)0x0) {
                  p->alignType = 2;
                }
              }
              else {
                p->alignType = 0;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void nsvg__parseSVG(NSVGparser* p, const char** attr)
{
	int i;
	for (i = 0; attr[i]; i += 2) {
		if (!nsvg__parseAttr(p, attr[i], attr[i + 1])) {
			if (strcmp(attr[i], "width") == 0) {
				p->image->width = nsvg__parseCoordinate(p, attr[i + 1], 0.0f, 1.0f);
			} else if (strcmp(attr[i], "height") == 0) {
				p->image->height = nsvg__parseCoordinate(p, attr[i + 1], 0.0f, 1.0f);
			} else if (strcmp(attr[i], "viewBox") == 0) {
				sscanf(attr[i + 1], "%f%*[%%, \t]%f%*[%%, \t]%f%*[%%, \t]%f", &p->viewMinx, &p->viewMiny, &p->viewWidth, &p->viewHeight);
			} else if (strcmp(attr[i], "preserveAspectRatio") == 0) {
				if (strstr(attr[i + 1], "none") != 0) {
					// No uniform scaling
					p->alignType = NSVG_ALIGN_NONE;
				} else {
					// Parse X align
					if (strstr(attr[i + 1], "xMin") != 0)
						p->alignX = NSVG_ALIGN_MIN;
					else if (strstr(attr[i + 1], "xMid") != 0)
						p->alignX = NSVG_ALIGN_MID;
					else if (strstr(attr[i + 1], "xMax") != 0)
						p->alignX = NSVG_ALIGN_MAX;
					// Parse X align
					if (strstr(attr[i + 1], "yMin") != 0)
						p->alignY = NSVG_ALIGN_MIN;
					else if (strstr(attr[i + 1], "yMid") != 0)
						p->alignY = NSVG_ALIGN_MID;
					else if (strstr(attr[i + 1], "yMax") != 0)
						p->alignY = NSVG_ALIGN_MAX;
					// Parse meet/slice
					p->alignType = NSVG_ALIGN_MEET;
					if (strstr(attr[i + 1], "slice") != 0)
						p->alignType = NSVG_ALIGN_SLICE;
				}
			}
		}
	}
}